

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef
CompileLlvmFunctionContextAccess(LlvmCompilationContext *ctx,ExprFunctionContextAccess *node)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  LLVMValueRefOpaque **ppLVar3;
  LLVMValueRef pLVar4;
  
  pTVar1 = node->function->contextType;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x671,
                  "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                 );
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 != (_func_int **)0x0) && (*(int *)(pp_Var2 + 1) == 0x18)) {
    if (pp_Var2[6] == (_func_int *)0x0) {
      CompileLlvmType(ctx,(node->super_ExprBase).type);
    }
    else {
      ppLVar3 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                ::find(&ctx->variables,&node->contextVariable->uniqueId);
      if (ppLVar3 == (LLVMValueRefOpaque **)0x0) {
        __assert_fail("variable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x681,
                      "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                     );
      }
      CreateLlvmName(ctx,node->contextVariable->name->name);
    }
    pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
    return pLVar4;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x675,
                "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &ctx, ExprFunctionContextAccess *node)
{
	TypeRef *refType = getType<TypeRef>(node->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	LLVMValueRef value = NULL;

	if(classType->size == 0)
	{
		value = LLVMConstPointerNull(CompileLlvmType(ctx, node->type));
	}
	else
	{
		LLVMValueRef *variable = ctx.variables.find(node->contextVariable->uniqueId);

		assert(variable);

		LLVMValueRef address = *variable;

		value = LLVMBuildLoad(ctx.builder, address, CreateLlvmName(ctx, node->contextVariable->name->name));
	}

	return CheckType(ctx, node, value);
}